

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_perobj.cpp
# Opt level: O3

void set_together_method_proc(Am_Object *cmdobj)

{
  Am_Object::operator=(cmdobj,cmdobj);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"===== start ===== set together\n",0x1f);
  Am_Object::Set(0x51b0,0x65,10);
  Am_Object::Set(0x51b0,100,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=====  end  ===== set together\n",0x1f);
  std::ostream::flush();
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_together_method,
                 (Am_Object cmdobj))
{
  cmdobj = cmdobj;

  cout << "===== start ===== set together\n";
  rect.Set(Am_TOP, 10);
  rect.Set(Am_LEFT, 10);

  cout << "=====  end  ===== set together\n" << flush;
}